

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::PromReadData(FpgaIO *this,uint32_t addr,uint8_t *data,uint nbytes)

{
  BasePort *pBVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  long *plVar5;
  long lVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar12;
  quadlet_t read_data;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint8_t *local_40;
  undefined8 local_38;
  uint uVar11;
  
  local_38 = CONCAT44(in_register_0000000c,nbytes);
  local_48 = 0;
  bVar9 = false;
  if ((addr & 0xffffff) + nbytes < 0x1000000) {
    uVar12 = addr & 0xffffff | 0x3000000;
    local_40 = data;
    do {
      uVar11 = (uint)local_38;
      uVar10 = uVar11 - local_48;
      bVar9 = uVar11 < local_48 || uVar10 == 0;
      if (uVar11 < local_48 || uVar10 == 0) {
        return true;
      }
      if (0x3f < uVar10) {
        uVar10 = 0x40;
      }
      pBVar1 = (this->super_BoardIO).port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,(ulong)uVar12);
      if ((char)iVar3 == '\0') {
        return false;
      }
      local_4c = 7;
      uVar11 = 0;
      do {
        Amp1394_Sleep(1e-05);
        pBVar1 = (this->super_BoardIO).port;
        iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&local_4c);
        if ((char)iVar3 == '\0') {
          return false;
        }
        local_4c = local_4c & 7;
        uVar7 = uVar11 + 1;
      } while ((uVar11 < 7) && (uVar11 = uVar7, local_4c != 0));
      if (uVar7 == 8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"PromReadData: command failed to finish, status = ",0x31);
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        plVar5 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        lVar6 = *plVar5;
        *(uint *)((long)plVar5 + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)((long)plVar5 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        goto LAB_001181b2;
      }
      bVar2 = PromGetResult(this,&local_44,PROM_M25P16);
      if (!bVar2) {
        plVar5 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"PromReadData: failed to get PROM result",0x27);
LAB_001181af:
        lVar6 = *plVar5;
LAB_001181b2:
        std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        return false;
      }
      if ((local_44 & 0x3fffffff) != 0x40) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"PromReadData: incorrect number of bytes = ",0x2a);
        plVar5 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        goto LAB_001181af;
      }
      uVar4 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
      uVar8 = 0xc0;
      if (3 < uVar4) {
        uVar8 = 0x2000;
      }
      pBVar1 = (this->super_BoardIO).port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar8,local_40 + local_48,
                         (ulong)uVar10);
      uVar12 = uVar12 + uVar10;
      local_48 = local_48 + uVar10;
    } while ((char)iVar3 != '\0');
  }
  return bVar9;
}

Assistant:

bool FpgaIO::PromReadData(uint32_t addr, uint8_t *data,
                         unsigned int nbytes)
{
    uint32_t addr24 = addr&0x00ffffff;
    if (addr24+nbytes > 0x00ffffff)
        return false;
    quadlet_t write_data = 0x03000000|addr24;  // 03h = Read Data Bytes
    uint32_t page = 0;
    while (page < nbytes) {
        const unsigned int maxReadSize = 64u;
        unsigned int bytesToRead = ((nbytes-page)<maxReadSize) ? (nbytes-page) : maxReadSize;
        if (!port->WriteQuadlet(BoardId, 0x08, write_data))
            return false;
        // Read FPGA status register; if 3 LSB are 0, command has finished.
        // The IEEE-1394 clock is 24.576 MHz, so it should take
        // about 256*8*(1/24.576) = 83.3 microseconds to read 256 bytes.
        // Experimentally, 1 iteration of the loop below is sufficient
        // most of the time, with 2 iterations required occasionally.
        quadlet_t read_data = 0x0007;
        int i;
        const int MAX_LOOP_CNT = 8;
        for (i = 0; (i < MAX_LOOP_CNT) && read_data; i++) {
            Amp1394_Sleep(0.00001);   // 10 usec
            if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return false;
            read_data = read_data&0x0007;
        }
        if (i == MAX_LOOP_CNT) {
            std::cout << "PromReadData: command failed to finish, status = "
                      << std::hex << read_data << std::dec << std::endl;
            return false;
        }
        // Now, read result. This should be the number of quadlets read.
        uint32_t nRead;
        if (!PromGetResult(nRead)) {
            std::cout << "PromReadData: failed to get PROM result" << std::endl;
            return false;
        }
        nRead *= 4;
        // should never happen, as for now firmware always reads 256 bytes
        // and saves to local registers in FPGA
        if (nRead != 256) {
            std::cout << "PromReadData: incorrect number of bytes = "
                      << nRead << std::endl;
            return false;
        }

        uint32_t fver = GetFirmwareVersion();
        nodeaddr_t address;
        if (fver >= 4) {address = 0x2000;}
        else {address = 0xc0;}
        if (!port->ReadBlock(BoardId, address, (quadlet_t *)(data+page), bytesToRead))
            return false;
        write_data += bytesToRead;
        page += bytesToRead;
    }
    return true;
}